

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkSuppSizeTest(Abc_Ntk_t *p)

{
  int iVar1;
  abctime aVar2;
  Abc_Obj_t *pObj;
  abctime aVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = 0;
  aVar2 = Abc_Clock();
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pObj = Abc_NtkObj(p,iVar5);
    if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_ObjSuppSize(pObj);
      uVar4 = uVar4 + (iVar1 < 0x11);
    }
  }
  iVar5 = 0x674171;
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar4,(ulong)(uint)p->nObjCounts[7]);
  aVar3 = Abc_Clock();
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return uVar4;
}

Assistant:

int Abc_NtkSuppSizeTest( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    Abc_NtkForEachObj( p, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter += (Abc_ObjSuppSize(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Abc_NtkNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}